

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * __thiscall
c4::MemoryResource::reallocate
          (MemoryResource *this,void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  void *pvVar1;
  
  pvVar1 = (void *)(**(code **)(*(long *)this + 0x18))();
  if (pvVar1 == (void *)0x0) {
    reallocate();
  }
  return pvVar1;
}

Assistant:

void* reallocate(void* ptr, size_t oldsz, size_t newsz, size_t alignment=alignof(max_align_t))
    {
        void *mem = this->do_reallocate(ptr, oldsz, newsz, alignment);
        C4_CHECK_MSG(mem != nullptr, "could not reallocate from %lu to %lu bytes", oldsz, newsz);
        return mem;
    }